

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

bool __thiscall QSqlTableModel::deleteRowFromTable(QSqlTableModel *this,int row)

{
  byte bVar1;
  bool bVar2;
  QSqlTableModelPrivate *stmt_00;
  QSqlDriver *pQVar3;
  undefined4 in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  bool prepStatement;
  QSqlTableModelPrivate *d;
  QString where;
  QString stmt;
  QSqlRecord whereValues;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  undefined6 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  char *in_stack_fffffffffffffee8;
  QString *pQVar4;
  ErrorType in_stack_ffffffffffffff0c;
  undefined1 in_stack_ffffffffffffff10 [16];
  undefined7 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  int row_00;
  bool local_b9;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 local_30 [8];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  stmt_00 = d_func((QSqlTableModel *)0x16e894);
  row_00 = (int)((ulong)pQVar4 >> 0x20);
  beforeDelete((QSqlTableModel *)0x16e8a7,in_stack_fffffffffffffedc);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  primaryValues(in_stack_ffffffffffffff10._8_8_,row_00);
  pQVar3 = QSqlDatabase::driver(&stmt_00->db);
  bVar1 = (**(code **)(*(long *)pQVar3 + 0xb8))(pQVar3,4);
  bVar1 = bVar1 & 1;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  pQVar3 = QSqlDatabase::driver(&stmt_00->db);
  pQVar4 = &stmt_00->tableName;
  QSqlRecord::QSqlRecord
            ((QSqlRecord *)
             CONCAT17(in_stack_fffffffffffffee7,
                      CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)));
  (**(code **)(*(long *)pQVar3 + 0xa8))(&local_28,pQVar3,4,pQVar4,local_30,bVar1 & 1);
  QSqlRecord::~QSqlRecord((QSqlRecord *)0x16e996);
  local_48 = 0xaaaaaaaaaaaaaaaa;
  local_40 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  pQVar3 = QSqlDatabase::driver(&stmt_00->db);
  (**(code **)(*(long *)pQVar3 + 0xa8))(&local_48,pQVar3,0,&stmt_00->tableName,&local_10,bVar1 & 1);
  bVar2 = QString::isEmpty((QString *)0x16ea18);
  if (!bVar2) {
    bVar2 = QString::isEmpty((QString *)0x16ea29);
    if (!bVar2) {
      QSqlQueryModelSql::concat(in_stack_ffffffffffffff10._8_8_,in_stack_ffffffffffffff10._0_8_);
      QSqlRecord::QSqlRecord
                ((QSqlRecord *)
                 CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)));
      local_b9 = QSqlTableModelPrivate::exec
                           ((QSqlTableModelPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffff30),
                            (QString *)stmt_00,(bool)bVar1,in_stack_ffffffffffffff10._8_8_,
                            in_stack_ffffffffffffff10._0_8_);
      QSqlRecord::~QSqlRecord((QSqlRecord *)0x16eb6f);
      QString::~QString((QString *)0x16eb79);
      goto LAB_0016eb81;
    }
  }
  latin1 = Qt::Literals::StringLiterals::operator____L1
                     (in_stack_fffffffffffffee8,
                      CONCAT17(in_stack_fffffffffffffee7,
                               CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)));
  QString::QString(in_RDI,latin1);
  QString::QString((QString *)0x16ea71);
  QString::QString((QString *)0x16ea7e);
  QSqlError::QSqlError
            ((QSqlError *)CONCAT17(bVar1,in_stack_ffffffffffffff20),(QString *)latin1.m_data,
             (QString *)latin1.m_size,in_stack_ffffffffffffff0c,pQVar4);
  QSqlError::operator=
            ((QSqlError *)
             CONCAT17(in_stack_fffffffffffffee7,
                      CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)),
             (QSqlError *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  QSqlError::~QSqlError((QSqlError *)0x16eace);
  QString::~QString((QString *)0x16eadb);
  QString::~QString((QString *)0x16eae8);
  QString::~QString((QString *)0x16eaf5);
  local_b9 = false;
LAB_0016eb81:
  QString::~QString((QString *)0x16eb8e);
  QString::~QString((QString *)0x16eb9b);
  QSqlRecord::~QSqlRecord((QSqlRecord *)0x16eba8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_b9;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlTableModel::deleteRowFromTable(int row)
{
    Q_D(QSqlTableModel);
    emit beforeDelete(row);

    const QSqlRecord whereValues = primaryValues(row);
    const bool prepStatement = d->db.driver()->hasFeature(QSqlDriver::PreparedQueries);
    const QString stmt = d->db.driver()->sqlStatement(QSqlDriver::DeleteStatement,
                                                      d->tableName,
                                                      QSqlRecord(),
                                                      prepStatement);
    const QString where = d->db.driver()->sqlStatement(QSqlDriver::WhereStatement,
                                                       d->tableName,
                                                       whereValues,
                                                       prepStatement);

    if (stmt.isEmpty() || where.isEmpty()) {
        d->error = QSqlError("Unable to delete row"_L1, QString(), QSqlError::StatementError);
        return false;
    }

    return d->exec(SqlTm::concat(stmt, where), prepStatement, QSqlRecord() /* no new values */, whereValues);
}